

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sys_TlsMgr.cpp
# Opt level: O2

bool axl::sys::deleteSimpleTlsSlot(size_t key)

{
  uint_t code;
  BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError> BStack_28;
  
  code = pthread_key_delete((pthread_key_t)key);
  if (code != 0) {
    err::ErrorRef::ErrorRef((ErrorRef *)&BStack_28,code);
    err::setError((ErrorRef *)&BStack_28);
    rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::~BufRef(&BStack_28);
  }
  return code == 0;
}

Assistant:

bool
deleteSimpleTlsSlot(size_t key) {
	int result = ::pthread_key_delete((pthread_key_t)key);
	return result != 0 ? err::fail(result) : true;
}